

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_coc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  uint_fast16_t val;
  int iVar1;
  int iVar2;
  jpc_coxcp_t *out_00;
  jpc_coxcp_t *in_R8;
  
  if ((ms->parms).coc.compparms.numdlvls < 0x21) {
    val = (ms->parms).sot.tileno;
    if (cstate->numcomps < 0x101) {
      iVar1 = jpc_putuint8(out,(uint_fast8_t)val);
    }
    else {
      iVar1 = jpc_putuint16(out,val);
    }
    iVar2 = -1;
    if (iVar1 == 0) {
      out_00 = &(ms->parms).coc.compparms;
      iVar1 = jpc_putuint8(out,out_00->csty);
      iVar2 = -1;
      if (iVar1 == 0) {
        iVar1 = jpc_cox_putcompparms
                          ((jpc_ms_t *)out,(jpc_cstate_t *)(ulong)(out_00->csty & 1),
                           (jas_stream_t *)out_00,0,in_R8);
        iVar2 = -(uint)(iVar1 != 0);
      }
    }
    return iVar2;
  }
  __assert_fail("coc->compparms.numdlvls <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_cs.c"
                ,0x2e7,"int jpc_coc_putparms(jpc_ms_t *, jpc_cstate_t *, jas_stream_t *)");
}

Assistant:

static int jpc_coc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_coc_t *coc = &ms->parms.coc;
	assert(coc->compparms.numdlvls <= 32);
	if (cstate->numcomps <= 256) {
		if (jpc_putuint8(out, coc->compno)) {
			return -1;
		}
	} else {
		if (jpc_putuint16(out, coc->compno)) {
			return -1;
		}
	}
	if (jpc_putuint8(out, coc->compparms.csty)) {
		return -1;
	}
	if (jpc_cox_putcompparms(ms, cstate, out,
	  (coc->compparms.csty & JPC_COX_PRT) != 0, &coc->compparms)) {
		return -1;
	}
	return 0;
}